

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_opt_goal(REF_DBL *metric,REF_GRID ref_grid,REF_INT nequations,REF_DBL *solution,
                   REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
                   REF_DBL target_complexity)

{
  size_t sVar1;
  undefined8 *puVar2;
  int iVar3;
  REF_NODE pRVar4;
  REF_GLOB *pRVar5;
  bool bVar6;
  REF_STATUS RVar7;
  uint uVar8;
  long *plVar9;
  REF_DBL *pRVar10;
  REF_DBL *pRVar11;
  ulong uVar12;
  REF_DBL *unaff_RBP;
  ulong uVar13;
  long lVar14;
  long lVar15;
  REF_DBL *pRVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  REF_STATUS local_a4;
  REF_DBL *local_80;
  REF_DBL *local_78;
  REF_DBL *local_70;
  REF_DBL *local_58;
  
  pRVar4 = ref_grid->node;
  iVar3 = pRVar4->max;
  if (0 < (long)iVar3) {
    plVar9 = pRVar4->global;
    uVar13 = 0;
    do {
      if (-1 < *plVar9) {
        uVar17 = uVar13 & 0x7fffffff0;
        puVar2 = (undefined8 *)((long)metric + uVar17 + 0x20);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)metric + uVar17 + 0x10);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)metric + uVar17) = 0;
        ((undefined8 *)((long)metric + uVar17))[1] = 0;
      }
      uVar13 = uVar13 + 0x30;
      plVar9 = plVar9 + 1;
    } while ((long)iVar3 * 0x30 != uVar13);
  }
  if (0 < nequations) {
    uVar13 = (ulong)(uint)nequations;
    local_58 = solution + uVar13;
    uVar17 = 0;
    do {
      iVar3 = pRVar4->max;
      if ((long)iVar3 < 0) {
        bVar6 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa51,"ref_metric_opt_goal");
        local_a4 = 1;
      }
      else {
        sVar1 = (long)iVar3 * 8;
        local_70 = (REF_DBL *)malloc(sVar1);
        if (local_70 == (REF_DBL *)0x0) {
          local_70 = (REF_DBL *)0x0;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa51,"ref_metric_opt_goal");
          local_a4 = 2;
          bVar6 = false;
        }
        else {
          bVar6 = true;
          if (iVar3 != 0) {
            memset(local_70,0,sVar1);
          }
        }
      }
      if (bVar6) {
        uVar19 = (ulong)(uint)pRVar4->max;
        if (pRVar4->max < 0) {
          bVar6 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa52,"ref_metric_opt_goal");
          local_a4 = 1;
        }
        else {
          unaff_RBP = (REF_DBL *)malloc(uVar19 * 0x18);
          if (unaff_RBP == (REF_DBL *)0x0) {
            unaff_RBP = (REF_DBL *)0x0;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa52,"ref_metric_opt_goal");
            local_a4 = 2;
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (uVar19 != 0) {
              uVar12 = uVar19 * 3 & 0xffffffff;
              if ((int)(uVar19 * 3) < 2) {
                uVar12 = 1;
              }
              memset(unaff_RBP,0,uVar12 << 3);
            }
          }
        }
        if (!bVar6) goto LAB_001c88a2;
        iVar3 = pRVar4->max;
        if ((long)iVar3 < 0) {
          bVar6 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa53,"ref_metric_opt_goal");
          local_a4 = 1;
        }
        else {
          sVar1 = (long)iVar3 * 8;
          local_80 = (REF_DBL *)malloc(sVar1);
          if (local_80 == (REF_DBL *)0x0) {
            local_80 = (REF_DBL *)0x0;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa53,"ref_metric_opt_goal");
            local_a4 = 2;
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (iVar3 != 0) {
              memset(local_80,0,sVar1);
            }
          }
        }
        if (!bVar6) goto LAB_001c88a2;
        uVar19 = (ulong)(uint)pRVar4->max;
        if (pRVar4->max < 0) {
          bVar6 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa54,"ref_metric_opt_goal");
          local_a4 = 1;
        }
        else {
          local_78 = (REF_DBL *)malloc(uVar19 * 0x30);
          if (local_78 == (REF_DBL *)0x0) {
            local_78 = (REF_DBL *)0x0;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa54,"ref_metric_opt_goal");
            local_a4 = 2;
            bVar6 = false;
          }
          else {
            bVar6 = true;
            if (uVar19 != 0) {
              uVar12 = uVar19 * 6 & 0xffffffff;
              if ((int)(uVar19 * 6) < 2) {
                uVar12 = 1;
              }
              memset(local_78,0,uVar12 << 3);
            }
          }
        }
        if (!bVar6) goto LAB_001c88a2;
        iVar3 = pRVar4->max;
        if (0 < (long)iVar3) {
          pRVar5 = pRVar4->global;
          lVar14 = 0;
          pRVar10 = solution;
          do {
            if (-1 < pRVar5[lVar14]) {
              local_70[lVar14] = *pRVar10;
            }
            lVar14 = lVar14 + 1;
            pRVar10 = pRVar10 + (uint)(nequations * 4);
          } while (iVar3 != lVar14);
        }
        RVar7 = ref_recon_gradient(ref_grid,local_70,unaff_RBP,reconstruction);
        if (RVar7 == 0) {
          lVar14 = 0;
          pRVar10 = local_58;
          do {
            iVar3 = pRVar4->max;
            if (0 < (long)iVar3) {
              pRVar5 = pRVar4->global;
              lVar15 = 0;
              pRVar11 = pRVar10;
              do {
                if (-1 < pRVar5[lVar15]) {
                  local_80[lVar15] = *pRVar11;
                }
                lVar15 = lVar15 + 1;
                pRVar11 = pRVar11 + (uint)(nequations * 4);
              } while (iVar3 != lVar15);
            }
            RVar7 = ref_recon_hessian(ref_grid,local_80,local_78,reconstruction);
            if (RVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xa5f,"ref_metric_opt_goal");
              local_a4 = RVar7;
              goto LAB_001c88a2;
            }
            iVar3 = pRVar4->max;
            if (0 < (long)iVar3) {
              pRVar5 = pRVar4->global;
              lVar15 = 0;
              pRVar11 = local_78;
              pRVar16 = metric;
              do {
                if (-1 < pRVar5[lVar15]) {
                  lVar18 = 0;
                  do {
                    dVar20 = unaff_RBP[lVar15 * 3 + lVar14];
                    if (dVar20 <= -dVar20) {
                      dVar20 = -dVar20;
                    }
                    pRVar16[lVar18] = dVar20 * pRVar11[lVar18] + pRVar16[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 6);
                }
                lVar15 = lVar15 + 1;
                pRVar16 = pRVar16 + 6;
                pRVar11 = pRVar11 + 6;
              } while (lVar15 != iVar3);
            }
            lVar14 = lVar14 + 1;
            pRVar10 = pRVar10 + uVar13;
          } while (lVar14 != 3);
          if (local_78 != (REF_DBL *)0x0) {
            free(local_78);
          }
          if (local_80 != (REF_DBL *)0x0) {
            free(local_80);
          }
          if (unaff_RBP != (REF_DBL *)0x0) {
            free(unaff_RBP);
          }
          bVar6 = true;
          if (local_70 != (REF_DBL *)0x0) {
            free(local_70);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa59,"ref_metric_opt_goal");
          bVar6 = false;
          local_a4 = RVar7;
        }
      }
      else {
LAB_001c88a2:
        bVar6 = false;
      }
      if (!bVar6) {
        return local_a4;
      }
      uVar17 = uVar17 + 1;
      solution = solution + 1;
      local_58 = local_58 + 1;
    } while (uVar17 != uVar13);
  }
  if ((ref_grid->twod != 0) && (iVar3 = pRVar4->max, 0 < (long)iVar3)) {
    pRVar5 = pRVar4->global;
    pRVar10 = metric + 5;
    lVar14 = 0;
    do {
      if (-1 < pRVar5[lVar14]) {
        pRVar10[-3] = 0.0;
        pRVar10[-1] = 0.0;
        *pRVar10 = 1.0;
      }
      lVar14 = lVar14 + 1;
      pRVar10 = pRVar10 + 6;
    } while (iVar3 != lVar14);
  }
  uVar8 = ref_recon_roundoff_limit(metric,ref_grid);
  if (uVar8 == 0) {
    uVar8 = ref_metric_local_scale(metric,ref_grid,p_norm);
    if (uVar8 == 0) {
      uVar8 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,target_complexity);
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa7a,"ref_metric_opt_goal",(ulong)uVar8,"gradation at complexity");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa76,"ref_metric_opt_goal",(ulong)uVar8,"local scale lp norm");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa74,
           "ref_metric_opt_goal",(ulong)uVar8,
           "floor metric eigenvalues based on grid size and solution jitter");
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_metric_opt_goal(REF_DBL *metric, REF_GRID ref_grid,
                                       REF_INT nequations, REF_DBL *solution,
                                       REF_RECON_RECONSTRUCTION reconstruction,
                                       REF_INT p_norm, REF_DBL gradation,
                                       REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT ldim;
  REF_INT var, dir;

  ldim = 4 * nequations;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) metric[i + 6 * node] = 0.0;
  }

  for (var = 0; var < nequations; var++) {
    REF_DBL *lam, *grad_lam, *flux, *hess_flux;
    ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = solution[var + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");

    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        flux[node] = solution[var + nequations * (1 + dir) + ldim * node];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++)
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
      }
    }
    ref_free(hess_flux);
    ref_free(flux);
    ref_free(grad_lam);
    ref_free(lam);
  }
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");

  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}